

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O0

bool __thiscall
phyr::Sphere::intersectRay(Sphere *this,Ray *ray,double *t0,SurfaceInteraction *si,bool testAlpha)

{
  FPError b_00;
  FPError c_00;
  bool bVar1;
  void *in_RCX;
  double *in_RDX;
  Vector3f *in_RDI;
  byte in_R8B;
  double dVar2;
  double dVar3;
  double _y;
  double dVar4;
  double extraout_XMM0_Qa;
  Vector3f pfError;
  Normal3f dndv;
  Normal3f dndu;
  Vector3f d2pdvv;
  Vector3f d2pduv;
  Vector3f d2pduu;
  Vector3f dpdv;
  Vector3f dpdu;
  double sinPhi;
  double cosPhi;
  double invHypot;
  double hypot;
  double v;
  double u;
  double theta;
  double phi;
  double delTheta;
  double twoPi;
  Point3f hpt;
  FPError tt0;
  FPError t2;
  FPError t1;
  FPError c;
  FPError b;
  FPError a;
  FPError dz;
  FPError dy;
  FPError dx;
  FPError oz;
  FPError oy;
  FPError ox;
  Ray lr;
  Vector3f rdErr;
  Vector3f roErr;
  Vector3<double> *v_00;
  Normal3<double> *v_01;
  double in_stack_fffffffffffff630;
  Vector3<double> *this_00;
  double in_stack_fffffffffffff638;
  Point3<double> *p2;
  FPError *in_stack_fffffffffffff640;
  Point3<double> *p1;
  FPError *in_stack_fffffffffffff648;
  FPError *in_stack_fffffffffffff650;
  Ray *this_01;
  FPError *in_stack_fffffffffffff678;
  FPError *in_stack_fffffffffffff680;
  Vector3f *dpdu_00;
  Point2f *in_stack_fffffffffffff6b0;
  Vector3f *in_stack_fffffffffffff6b8;
  Vector3f *pfError_00;
  Ray *in_stack_fffffffffffff6c8;
  SurfaceInteraction *in_stack_fffffffffffff6d0;
  Vector3f *in_stack_fffffffffffff6e0;
  Normal3f *in_stack_fffffffffffff6e8;
  Normal3f *in_stack_fffffffffffff6f0;
  Shape *in_stack_fffffffffffff6f8;
  Normal3f *in_stack_fffffffffffff748;
  Vector3f *in_stack_fffffffffffff750;
  Vector3f *in_stack_fffffffffffff758;
  Vector3f *in_stack_fffffffffffff760;
  Vector3f *in_stack_fffffffffffff768;
  Vector3f *in_stack_fffffffffffff770;
  Normal3f *in_stack_fffffffffffff780;
  FPError *in_stack_fffffffffffff7c0;
  FPError *in_stack_fffffffffffff7c8;
  FPError in_stack_fffffffffffff7e0;
  undefined1 in_stack_fffffffffffff7f8 [16];
  SurfaceInteraction *in_stack_fffffffffffff808;
  Transform *in_stack_fffffffffffff810;
  undefined1 in_stack_fffffffffffff818 [16];
  undefined1 local_758 [440];
  Vector3<double> local_5a0 [3];
  Normal3<double> local_558;
  Normal3<double> local_540;
  Vector3<double> local_528 [2];
  Vector3<double> local_4f8 [2];
  Vector3<double> local_4c8 [2];
  Vector3<double> local_498 [2];
  Vector3<double> local_468;
  double local_450;
  double local_448;
  double local_440;
  double local_438;
  double local_430;
  double local_428;
  double local_420;
  double local_418;
  double local_410;
  double local_408;
  Point3<double> local_400;
  double local_3e8;
  double local_3e0;
  double local_3d8;
  Point3<double> local_3d0;
  Point3<double> local_3b8;
  FPError local_3a0;
  double local_388;
  Ray *local_380;
  undefined8 local_378;
  Point3<double> *local_370;
  undefined8 local_368;
  undefined8 local_360;
  Vector3<double> *local_358;
  Vector3<double> *local_350;
  Point3<double> *local_348;
  FPError local_340;
  FPError local_328 [9];
  double local_250;
  Ray *local_248;
  undefined8 local_240;
  Point3<double> *local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  Vector3<double> *local_148;
  Vector3<double> *local_140;
  Point3<double> *local_138;
  double local_70;
  Vector3<double> local_68;
  Vector3<double> local_50;
  byte local_31;
  void *local_30;
  double *local_28;
  bool local_9;
  
  local_31 = in_R8B & 1;
  local_30 = in_RCX;
  local_28 = in_RDX;
  Vector3<double>::Vector3(&local_50);
  Vector3<double>::Vector3(&local_68);
  Transform::operator()
            ((Transform *)in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8,in_RDI,
             in_stack_fffffffffffff6b8);
  FPError::FPError(in_stack_fffffffffffff640,in_stack_fffffffffffff638,in_stack_fffffffffffff630);
  FPError::FPError(in_stack_fffffffffffff640,in_stack_fffffffffffff638,in_stack_fffffffffffff630);
  FPError::FPError(in_stack_fffffffffffff640,in_stack_fffffffffffff638,in_stack_fffffffffffff630);
  FPError::FPError(in_stack_fffffffffffff640,in_stack_fffffffffffff638,in_stack_fffffffffffff630);
  FPError::FPError(in_stack_fffffffffffff640,in_stack_fffffffffffff638,in_stack_fffffffffffff630);
  FPError::FPError(in_stack_fffffffffffff640,in_stack_fffffffffffff638,in_stack_fffffffffffff630);
  FPError::operator*(in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  FPError::operator*(in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  FPError::operator+(in_stack_fffffffffffff650,in_stack_fffffffffffff648);
  FPError::operator*(in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  FPError::operator+(in_stack_fffffffffffff650,in_stack_fffffffffffff648);
  FPError::operator*(in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  FPError::operator*(in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  FPError::operator+(in_stack_fffffffffffff650,in_stack_fffffffffffff648);
  FPError::operator*(in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  FPError::operator+(in_stack_fffffffffffff650,in_stack_fffffffffffff648);
  phyr::operator*((double)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
  FPError::operator*(in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  FPError::operator*(in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  FPError::operator+(in_stack_fffffffffffff650,in_stack_fffffffffffff648);
  FPError::operator*(in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  FPError::operator+(in_stack_fffffffffffff650,in_stack_fffffffffffff648);
  FPError::FPError(in_stack_fffffffffffff640,in_stack_fffffffffffff638,in_stack_fffffffffffff630);
  FPError::FPError(in_stack_fffffffffffff640,in_stack_fffffffffffff638,in_stack_fffffffffffff630);
  FPError::operator*(in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  FPError::operator-(in_stack_fffffffffffff650,in_stack_fffffffffffff648);
  FPError::FPError(local_328);
  FPError::FPError(&local_340);
  local_358 = local_148;
  local_350 = local_140;
  local_348 = local_138;
  local_370 = local_1c0;
  local_368 = local_1b8;
  local_360 = local_1b0;
  local_388 = local_250;
  local_380 = local_248;
  local_378 = local_240;
  b_00.uBound = (double)in_stack_fffffffffffff808;
  b_00.v = (double)in_stack_fffffffffffff7f8._0_8_;
  b_00.lBound = (double)in_stack_fffffffffffff7f8._8_8_;
  c_00.lBound = (double)in_stack_fffffffffffff818._0_8_;
  c_00.uBound = (double)in_stack_fffffffffffff818._8_8_;
  c_00.v = (double)in_stack_fffffffffffff810;
  bVar1 = solveQuadraticSystem
                    (in_stack_fffffffffffff7e0,b_00,c_00,in_stack_fffffffffffff7c8,
                     in_stack_fffffffffffff7c0);
  if (bVar1) {
    dVar2 = FPError::upperBound(local_328);
    if ((local_70 < dVar2) || (dVar2 = FPError::lowerBound(&local_340), dVar2 <= 0.0)) {
      local_9 = false;
    }
    else {
      local_3a0.v = local_328[0].v;
      local_3a0.lBound = local_328[0].lBound;
      local_3a0.uBound = local_328[0].uBound;
      dVar3 = FPError::lowerBound(&local_3a0);
      v_00 = local_148;
      this_00 = local_140;
      p2 = local_138;
      p1 = local_1c0;
      dVar2 = local_250;
      this_01 = local_248;
      if (dVar3 <= 0.0) {
        local_3a0.v = local_340.v;
        local_3a0.lBound = local_340.lBound;
        local_3a0.uBound = local_340.uBound;
        dVar3 = FPError::upperBound(&local_3a0);
        v_00 = local_148;
        this_00 = local_140;
        p2 = local_138;
        p1 = local_1c0;
        dVar2 = local_250;
        this_01 = local_248;
        if (local_70 < dVar3) {
          return false;
        }
      }
      FPError::operator_cast_to_double(&local_3a0);
      Ray::operator()(this_01,dVar2);
      pfError_00 = (Vector3f *)in_RDI[1].y;
      Point3<double>::Point3(&local_3d0,0.0,0.0,0.0);
      dVar3 = distance<double>(p1,p2);
      Point3<double>::operator*=(&local_3b8,(double)pfError_00 / dVar3);
      if (((-in_RDI[1].y < in_RDI[1].z) && (local_3b8.z < in_RDI[1].z)) ||
         ((in_RDI[2].x < in_RDI[1].y && (in_RDI[2].x <= local_3b8.z && local_3b8.z != in_RDI[2].x)))
         ) {
        bVar1 = FPError::operator==(&local_3a0,&local_340);
        if (bVar1) {
          return false;
        }
        dVar3 = FPError::upperBound(&local_3a0);
        if (local_70 < dVar3) {
          return false;
        }
        local_3a0.v = local_340.v;
        local_3a0.lBound = local_340.lBound;
        local_3a0.uBound = local_340.uBound;
        FPError::operator_cast_to_double(&local_3a0);
        Ray::operator()(this_01,dVar2);
        local_3b8.x = local_3e8;
        local_3b8.y = local_3e0;
        local_3b8.z = local_3d8;
        in_stack_fffffffffffff6b0 = (Point2f *)in_RDI[1].y;
        Point3<double>::Point3(&local_400,0.0,0.0,0.0);
        dVar2 = distance<double>(p1,p2);
        Point3<double>::operator*=(&local_3b8,(double)in_stack_fffffffffffff6b0 / dVar2);
        if (((-in_RDI[1].y < in_RDI[1].z) && (local_3b8.z < in_RDI[1].z)) ||
           ((in_RDI[2].x < in_RDI[1].y && (in_RDI[2].x <= local_3b8.z && local_3b8.z != in_RDI[2].x)
            ))) {
          return false;
        }
      }
      dVar2 = FPError::operator_cast_to_double(&local_3a0);
      *local_28 = dVar2;
      local_408 = 6.283185307179586;
      local_410 = in_RDI[2].z - in_RDI[2].y;
      if ((((local_3b8.x == 0.0) && (!NAN(local_3b8.x))) && (local_3b8.y == 0.0)) &&
         (!NAN(local_3b8.y))) {
        local_3b8.x = in_RDI[1].y * 9.999999747378752e-06;
      }
      local_418 = atan2(local_3b8.y,local_3b8.x);
      if (local_418 < 0.0) {
        local_418 = local_408 + local_418;
      }
      dVar2 = clamp((double)this_00,(double)v_00,8.39782646796555e-318);
      local_420 = acos(dVar2);
      local_428 = local_418 / local_408;
      local_430 = (local_420 - in_RDI[2].y) / local_410;
      local_438 = sqrt(local_3b8.x * local_3b8.x + local_3b8.y * local_3b8.y);
      local_440 = 1.0 / local_438;
      local_448 = local_3b8.x * local_440;
      local_450 = local_3b8.y * local_440;
      Vector3<double>::Vector3(&local_468,-local_408 * local_3b8.y,local_408 * local_3b8.x,0.0);
      dVar3 = local_3b8.z * local_448;
      _y = local_3b8.z * local_450;
      dVar2 = in_RDI[1].y;
      dVar4 = sin(local_420);
      Vector3<double>::Vector3(local_498,dVar3,_y,-dVar2 * dVar4);
      phyr::operator*((double)this_00,v_00);
      Vector3<double>::Vector3(local_4c8,local_3b8.x,local_3b8.y,0.0);
      phyr::operator*((double)this_00,v_00);
      Vector3<double>::Vector3(local_4f8,-local_450,local_448,0.0);
      phyr::operator*((double)this_00,v_00);
      Vector3<double>::Vector3(local_528,local_3b8.x,local_3b8.y,local_3b8.z);
      phyr::operator*((double)this_00,v_00);
      Normal3<double>::Normal3(&local_540);
      Normal3<double>::Normal3(&local_558);
      v_01 = &local_558;
      solveSurfaceNormal(in_stack_fffffffffffff770,in_stack_fffffffffffff768,
                         in_stack_fffffffffffff760,in_stack_fffffffffffff758,
                         in_stack_fffffffffffff750,in_stack_fffffffffffff748,
                         in_stack_fffffffffffff780);
      Vector3<double>::Vector3(local_5a0,&local_3b8);
      abs<double>((Vector3<double> *)p1);
      gamma(extraout_XMM0_Qa);
      Vector3<double>::operator*(this_00,(double)v_01);
      dpdu_00 = (Vector3f *)in_RDI->y;
      Vector3<double>::operator-(this_00);
      Point2<double>::Point2((Point2<double> *)&stack0xfffffffffffff6c8,local_428,local_430);
      SurfaceInteraction::SurfaceInteraction
                (in_stack_fffffffffffff6d0,&in_stack_fffffffffffff6c8->o,in_RDI,pfError_00,
                 in_stack_fffffffffffff6b0,dpdu_00,in_stack_fffffffffffff6e0,
                 in_stack_fffffffffffff6e8,in_stack_fffffffffffff6f0,in_stack_fffffffffffff6f8);
      Transform::operator()(in_stack_fffffffffffff810,in_stack_fffffffffffff808);
      memcpy(local_30,local_758,0x1b8);
      local_9 = true;
    }
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool Sphere::intersectRay(const Ray& ray, Real* t0, SurfaceInteraction* si,
                          bool testAlpha) const {
    Vector3f roErr, rdErr;
    // Transform ray to local space
    Ray lr = (*worldToLocal)(ray, &roErr, &rdErr);

    // Compute quadratic sphere coefficients
    FPError ox(lr.o.x, roErr.x), oy(lr.o.y, roErr.y), oz(lr.o.z, roErr.z);
    FPError dx(lr.d.x, rdErr.x), dy(lr.d.y, rdErr.y), dz(lr.d.z, rdErr.z);
    FPError a = dx * dx + dy * dy + dz * dz;
    FPError b = 2 * (ox * dx + oy * dy + oz * dz);
    FPError c = ox * ox + oy * oy + oz * oz - FPError(radius) * FPError(radius);

    // Solve quadratic equation for t
    FPError t1, t2;
    // No intersections
    if (!solveQuadraticSystem(a, b, c, &t1, &t2)) return false;

    // Check for trivial range exclusion
    if (t1.upperBound() > lr.tMax || t2.lowerBound() <= 0) return false;
    FPError tt0 = t1;
    if (tt0.lowerBound() <= 0) {
        tt0 = t2; if (tt0.upperBound() > lr.tMax) return false;
    }

    Point3f hpt = lr(Real(tt0));
    // Reproject the point onto the surface to refine it
    hpt *= radius / distance(hpt, Point3f(0, 0, 0));

    if ((zMin > -radius && hpt.z < zMin) || (zMax < radius && hpt.z > zMax)) {
        // If ray origin is inside the sphere and t2 intersects a clipped region
        if (tt0 == t2) return false;
        // We're looking at a hole in the sphere on the near side.
        // Test intersection with the farther side
        if (tt0.upperBound() > lr.tMax) return false;

        // Test with t1 failed, try t2
        tt0 = t2; hpt = lr(Real(tt0));
        // Reproject the point onto the surface to refine it
        hpt *= radius / distance(hpt, Point3f(0, 0, 0));

        if ((zMin > -radius && hpt.z < zMin) || (zMax < radius && hpt.z > zMax))
            return false;
    }

    *t0 = Real(tt0);
    Real twoPi = 2 * Pi, delTheta = thetaMax - thetaMin;

    // Make sure phi = atan(y / x) doesn't result in NaN
    if (hpt.x == 0 && hpt.y == 0) hpt.x = 1e-5f * radius;
    // Compute phi and theta values
    Real phi = std::atan2(hpt.y, hpt.x);
    // Cover the full range [0, 2*Pi] in a continuous cycle
    if (phi < 0) phi += twoPi;
    Real theta = std::acos(clamp(hpt.z / radius, -1, 1));

    // Compute (u, v) parameters from phi and theta
    Real u = phi / twoPi;
    Real v = (theta - thetaMin) / delTheta;

    // Compute partial derivatives for the sphere
    Real hypot = std::sqrt(hpt.x * hpt.x + hpt.y * hpt.y);
    Real invHypot = 1 / hypot;
    Real cosPhi = hpt.x * invHypot, sinPhi = hpt.y * invHypot;

    Vector3f dpdu = Vector3f(-twoPi * hpt.y, twoPi * hpt.x, 0);
    Vector3f dpdv = delTheta * Vector3f(hpt.z * cosPhi, hpt.z * sinPhi, -radius * std::sin(theta));

    // Compute second derivatives
    Vector3f d2pduu = -twoPi * twoPi * Vector3f(hpt.x, hpt.y, 0);
    Vector3f d2pduv = delTheta * hpt.z * twoPi * Vector3f(-sinPhi, cosPhi, 0);
    Vector3f d2pdvv = -delTheta * delTheta * Vector3f(hpt.x, hpt.y, hpt.z);

    // Compute surface normals
    Normal3f dndu, dndv;
    solveSurfaceNormal(dpdu, dpdv, d2pduu,d2pduv, d2pdvv, &dndu, &dndv);

    // Compute error bounds for ray-sphere intersection
    Vector3f pfError = abs(Vector3f(hpt)) * gamma(5);
    // Initiate the SurfaceInteraction object
    *si = (*localToWorld)(SurfaceInteraction(hpt, -lr.d, pfError,
                                             Point2f(u, v), dpdu, dpdv, dndu, dndv, this));

    return true;
}